

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateMergingCode
          (StringFieldGenerator *this,Printer *printer)

{
  char *text;
  
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa7) == '\0') {
    text = "set_$name$(from.$name$());\n";
    if (*(long *)(this->descriptor_ + 0x60) == 0) {
      text = "$set_hasbit$\n$name$_.AssignWithDefault($default_variable$, from.$name$_);\n";
    }
  }
  else {
    text = "set_$name$(from.$name$());\n";
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void StringFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  if (SupportsArenas(descriptor_) || descriptor_->containing_oneof() != NULL) {
    // TODO(gpike): improve this
    printer->Print(variables_, "set_$name$(from.$name$());\n");
  } else {
    printer->Print(variables_,
      "$set_hasbit$\n"
      "$name$_.AssignWithDefault($default_variable$, from.$name$_);\n");
  }
}